

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O3

void Aig_Compose_rec(Aig_Man_t *p,Aig_Obj_t *pObj,Aig_Obj_t *pFunc,Aig_Obj_t *pVar)

{
  ulong uVar1;
  Aig_Obj_t *p1;
  Aig_Obj_t *pAVar2;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigDfs.c"
                  ,0x3ba,"void Aig_Compose_rec(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Obj_t *)")
    ;
  }
  if ((*(ulong *)&pObj->field_0x18 & 0x10) == 0) {
    if ((ulong)((uint)*(ulong *)&pObj->field_0x18 & 7) - 1 < 2) {
      if (pObj != pVar) {
        pFunc = pObj;
      }
      (pObj->field_5).pData = pFunc;
    }
    else {
      Aig_Compose_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),pFunc,pVar);
      Aig_Compose_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),pFunc,pVar);
      uVar1 = (ulong)pObj->pFanin0 & 0xfffffffffffffffe;
      if (uVar1 == 0) {
        pAVar2 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar2 = (Aig_Obj_t *)((ulong)((uint)pObj->pFanin0 & 1) ^ *(ulong *)(uVar1 + 0x28));
      }
      uVar1 = (ulong)pObj->pFanin1 & 0xfffffffffffffffe;
      if (uVar1 == 0) {
        p1 = (Aig_Obj_t *)0x0;
      }
      else {
        p1 = (Aig_Obj_t *)((ulong)((uint)pObj->pFanin1 & 1) ^ *(ulong *)(uVar1 + 0x28));
      }
      pAVar2 = Aig_And(p,pAVar2,p1);
      (pObj->field_5).pData = pAVar2;
      if ((*(ulong *)&pObj->field_0x18 & 0x10) != 0) {
        __assert_fail("!Aig_ObjIsMarkA(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigDfs.c"
                      ,0x3c5,
                      "void Aig_Compose_rec(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Obj_t *)");
      }
      *(ulong *)&pObj->field_0x18 = *(ulong *)&pObj->field_0x18 | 0x10;
    }
  }
  return;
}

Assistant:

void Aig_Compose_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Aig_Obj_t * pFunc, Aig_Obj_t * pVar )
{
    assert( !Aig_IsComplement(pObj) );
    if ( Aig_ObjIsMarkA(pObj) )
        return;
    if ( Aig_ObjIsConst1(pObj) || Aig_ObjIsCi(pObj) )
    {
        pObj->pData = pObj == pVar ? pFunc : pObj;
        return;
    }
    Aig_Compose_rec( p, Aig_ObjFanin0(pObj), pFunc, pVar ); 
    Aig_Compose_rec( p, Aig_ObjFanin1(pObj), pFunc, pVar );
    pObj->pData = Aig_And( p, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    assert( !Aig_ObjIsMarkA(pObj) ); // loop detection
    Aig_ObjSetMarkA( pObj );
}